

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_binding.cpp
# Opt level: O0

bool lumeview::ImGui_CreateFontsTexture(void)

{
  GLuint local_24;
  GLsizei local_20;
  GLint last_texture;
  int height;
  int width;
  uchar *pixels;
  ImGuiIO *io;
  
  pixels = (uchar *)ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            (((ImGuiIO *)pixels)->Fonts,(uchar **)&height,&last_texture,&local_20,(int *)0x0);
  (*glad_glGetIntegerv)(0x8069,(GLint *)&local_24);
  (*glad_glGenTextures)(1,&g_FontTexture);
  (*glad_glBindTexture)(0xde1,g_FontTexture);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glPixelStorei)(0xcf2,0);
  (*glad_glTexImage2D)(0xde1,0,0x1908,last_texture,local_20,0,0x1908,0x1401,_height);
  *(ulong *)(*(long *)(pixels + 0x98) + 8) = (ulong)g_FontTexture;
  (*glad_glBindTexture)(0xde1,local_24);
  return true;
}

Assistant:

bool ImGui_CreateFontsTexture()
{
    // Build texture atlas
    ImGuiIO& io = ImGui::GetIO();
    unsigned char* pixels;
    int width, height;
    io.Fonts->GetTexDataAsRGBA32(&pixels, &width, &height);   // Load as RGBA 32-bits (75% of the memory is wasted, but default font is so small) because it is more likely to be compatible with user's existing shaders. If your ImTextureId represent a higher-level concept than just a GL texture id, consider calling GetTexDataAsAlpha8() instead to save on GPU memory.

    // Upload texture to graphics system
    GLint last_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    glGenTextures(1, &g_FontTexture);
    glBindTexture(GL_TEXTURE_2D, g_FontTexture);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glPixelStorei(GL_UNPACK_ROW_LENGTH, 0);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, pixels);

    // Store our identifier
    io.Fonts->TexID = (void *)(intptr_t)g_FontTexture;

    // Restore state
    glBindTexture(GL_TEXTURE_2D, last_texture);

    return true;
}